

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall gnilk::LogManager::IterateSinks(LogManager *this,SinkDelegate *delegate)

{
  lock_guard<std::mutex> this_00;
  bool bVar1;
  int iVar2;
  reference this_01;
  pointer pLVar3;
  undefined4 extraout_var;
  unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *sink;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
  *__range1;
  lock_guard<std::mutex> lock;
  SinkDelegate *delegate_local;
  LogManager *this_local;
  
  lock._M_device = (mutex_type *)delegate;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range1,&this->sinkLock);
  __end1 = std::
           vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
           ::begin(&this->sinks);
  sink = (unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *)
         std::
         vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
         ::end(&this->sinks);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
                      (&__end1,(__normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
                                *)&sink);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
              ::operator*(&__end1);
    this_00 = lock;
    pLVar3 = std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>::
             operator->(this_01);
    iVar2 = (*pLVar3->_vptr_LogSinkInstance[2])();
    std::function<bool_(gnilk::LogSink_*)>::operator()
              ((function<bool_(gnilk::LogSink_*)> *)this_00._M_device,
               (LogSink *)CONCAT44(extraout_var,iVar2));
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
    ::operator++(&__end1);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  return;
}

Assistant:

void LogManager::IterateSinks(const SinkDelegate &delegate) {
    std::lock_guard<std::mutex> lock(sinkLock);
    for(auto &sink : sinks) {
        delegate(sink->GetSink());
    }
}